

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

void printKTXHeader(KTX_header *pHeader)

{
  long in_RDI;
  _Bool in_stack_0000002f;
  ktx_uint8_t *in_stack_00000030;
  
  fprintf(_stdout,"identifier: ");
  printIdentifier(in_stack_00000030,in_stack_0000002f);
  fprintf(_stdout,"\n");
  fprintf(_stdout,"endianness: %#x\n",(ulong)*(uint *)(in_RDI + 0xc));
  fprintf(_stdout,"glType: %#x\n",(ulong)*(uint *)(in_RDI + 0x10));
  fprintf(_stdout,"glTypeSize: %u\n",(ulong)*(uint *)(in_RDI + 0x14));
  fprintf(_stdout,"glFormat: %#x\n",(ulong)*(uint *)(in_RDI + 0x18));
  fprintf(_stdout,"glInternalformat: %#x\n",(ulong)*(uint *)(in_RDI + 0x1c));
  fprintf(_stdout,"glBaseInternalformat: %#x\n",(ulong)*(uint *)(in_RDI + 0x20));
  fprintf(_stdout,"pixelWidth: %u\n",(ulong)*(uint *)(in_RDI + 0x24));
  fprintf(_stdout,"pixelHeight: %u\n",(ulong)*(uint *)(in_RDI + 0x28));
  fprintf(_stdout,"pixelDepth: %u\n",(ulong)*(uint *)(in_RDI + 0x2c));
  fprintf(_stdout,"numberOfArrayElements: %u\n",(ulong)*(uint *)(in_RDI + 0x30));
  fprintf(_stdout,"numberOfFaces: %u\n",(ulong)*(uint *)(in_RDI + 0x34));
  fprintf(_stdout,"numberOfMipLevels: %u\n",(ulong)*(uint *)(in_RDI + 0x38));
  fprintf(_stdout,"bytesOfKeyValueData: %u\n",(ulong)*(uint *)(in_RDI + 0x3c));
  return;
}

Assistant:

void
printKTXHeader(KTX_header* pHeader)
{
    fprintf(stdout, "identifier: ");
    printIdentifier(pHeader->identifier, false);
    fprintf(stdout, "\n");
    fprintf(stdout, "endianness: %#x\n", pHeader->endianness);
    fprintf(stdout, "glType: %#x\n", pHeader->glType);
    fprintf(stdout, "glTypeSize: %u\n", pHeader->glTypeSize);
    fprintf(stdout, "glFormat: %#x\n", pHeader->glFormat);
    fprintf(stdout, "glInternalformat: %#x\n", pHeader->glInternalformat);
    fprintf(stdout, "glBaseInternalformat: %#x\n",
            pHeader->glBaseInternalformat);
    fprintf(stdout, "pixelWidth: %u\n", pHeader->pixelWidth);
    fprintf(stdout, "pixelHeight: %u\n", pHeader->pixelHeight);
    fprintf(stdout, "pixelDepth: %u\n", pHeader->pixelDepth);
    fprintf(stdout, "numberOfArrayElements: %u\n",
            pHeader->numberOfArrayElements);
    fprintf(stdout, "numberOfFaces: %u\n", pHeader->numberOfFaces);
    fprintf(stdout, "numberOfMipLevels: %u\n", pHeader->numberOfMipLevels);
    fprintf(stdout, "bytesOfKeyValueData: %u\n", pHeader->bytesOfKeyValueData);
}